

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  bool bVar1;
  EXRHeader *exr_header_00;
  size_type sVar2;
  reference pvVar3;
  void *pvVar4;
  reference pvVar5;
  char **ppcVar6;
  ulong uVar7;
  long in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  long *in_RDI;
  ulong in_R8;
  size_t k;
  string _err;
  string warn;
  EXRHeader *exr_header;
  size_t i_2;
  int retcode;
  size_t i_1;
  size_t i;
  int ret;
  bool empty_header;
  string err_str;
  HeaderInfo info;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  size_t marker_size;
  uchar *marker;
  size_t in_stack_00000370;
  uchar *in_stack_00000378;
  string *in_stack_00000380;
  EXRVersion *in_stack_00000388;
  bool *in_stack_00000390;
  HeaderInfo *in_stack_00000398;
  char **in_stack_fffffffffffffd38;
  char **err_00;
  HeaderInfo *in_stack_fffffffffffffd40;
  string *msg;
  value_type *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  char **local_248;
  string local_240 [32];
  string local_220 [32];
  void *local_200;
  ulong local_1f8;
  int local_1f0;
  allocator local_1e9;
  string local_1e8 [32];
  ulong local_1c8;
  int local_1bc;
  ulong local_1b8;
  int local_1b0;
  byte local_1a9;
  string local_1a8 [56];
  vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> avStack_170 [3];
  int local_124;
  uint local_10c;
  pointer in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  HeaderInfo *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [40];
  ulong local_30;
  long local_20;
  undefined4 *local_18;
  long *local_10;
  int local_4;
  
  if ((((in_RCX == 0) || (in_RDI == (long *)0x0)) || (in_RSI == (undefined4 *)0x0)) || (in_RDX == 0)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"Invalid argument for ParseEXRMultipartHeaderFromMemory",&local_59);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_4 = -3;
  }
  else if (in_R8 < 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Data size too short",&local_91);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_4 = -4;
  }
  else {
    exr_header_00 = (EXRHeader *)(in_R8 - 8);
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)0x4926e9);
    do {
      tinyexr::HeaderInfo::HeaderInfo(in_stack_fffffffffffffd40);
      tinyexr::HeaderInfo::clear(in_stack_fffffffffffffd40);
      std::__cxx11::string::string(local_1a8);
      local_1a9 = 0;
      local_1b0 = tinyexr::ParseEXRHeader
                            (in_stack_00000398,in_stack_00000390,in_stack_00000388,in_stack_00000380
                             ,in_stack_00000378,in_stack_00000370);
      if (local_1b0 == 0) {
        if ((local_1a9 & 1) == 0) {
          if (local_124 == 0) {
            for (local_1c8 = 0; uVar7 = local_1c8,
                sVar2 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size
                                  (avStack_170), uVar7 < sVar2; local_1c8 = local_1c8 + 1) {
              pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                                 (avStack_170,local_1c8);
              if (pvVar3->value != (uchar *)0x0) {
                pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                                   (avStack_170,local_1c8);
                free(pvVar3->value);
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1e8,"`chunkCount\' attribute is not found in the header.",&local_1e9);
            tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            std::__cxx11::string::~string(local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            local_4 = -4;
            local_1bc = 1;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                       in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
            local_30 = local_30 - local_10c;
            local_1bc = 0;
          }
        }
        else {
          local_1bc = 2;
        }
      }
      else {
        for (local_1b8 = 0; uVar7 = local_1b8,
            sVar2 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size(avStack_170),
            uVar7 < sVar2; local_1b8 = local_1b8 + 1) {
          pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                             (avStack_170,local_1b8);
          if (pvVar3->value != (uchar *)0x0) {
            pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                               (avStack_170,local_1b8);
            free(pvVar3->value);
          }
        }
        tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_4 = local_1b0;
        local_1bc = 1;
      }
      std::__cxx11::string::~string(local_1a8);
      tinyexr::HeaderInfo::~HeaderInfo(in_stack_fffffffffffffd40);
    } while (local_1bc == 0);
    if (local_1bc == 2) {
      sVar2 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                         &stack0xffffffffffffff40);
      pvVar4 = malloc(sVar2 << 3);
      *local_10 = (long)pvVar4;
      local_1f0 = 0;
      for (local_1f8 = 0; uVar7 = local_1f8,
          sVar2 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                            ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                             &stack0xffffffffffffff40), uVar7 < sVar2; local_1f8 = local_1f8 + 1) {
        msg = (string *)0x188;
        local_200 = malloc(0x188);
        memset(local_200,0,(size_t)msg);
        in_stack_fffffffffffffd50 = local_220;
        std::__cxx11::string::string(in_stack_fffffffffffffd50);
        std::__cxx11::string::string(local_240);
        std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::operator[]
                  ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                   &stack0xffffffffffffff40,local_1f8);
        bVar1 = tinyexr::ConvertHeader
                          (exr_header_00,in_stack_ffffffffffffff50,
                           (string *)in_stack_ffffffffffffff48,(string *)in_stack_ffffffffffffff40);
        if (!bVar1) {
          local_248 = (char **)0x0;
          while( true ) {
            err_00 = local_248;
            pvVar5 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::
                     operator[]((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *
                                )&stack0xffffffffffffff40,local_1f8);
            ppcVar6 = (char **)std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size
                                         (&pvVar5->attributes);
            if (ppcVar6 <= err_00) break;
            pvVar5 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::
                     operator[]((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *
                                )&stack0xffffffffffffff40,local_1f8);
            pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                               (&pvVar5->attributes,0);
            if (pvVar3->value != (uchar *)0x0) {
              pvVar5 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::
                       operator[]((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                   *)&stack0xffffffffffffff40,local_1f8);
              pvVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                                 (&pvVar5->attributes,0);
              free(pvVar3->value);
            }
            local_1f8 = local_1f8 + 1;
          }
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            tinyexr::SetErrorMessage(msg,err_00);
          }
          local_1f0 = -9;
        }
        *(uint *)((long)local_200 + 0x54) = (uint)(*(int *)(local_20 + 0x10) != 0);
        *(void **)(*local_10 + local_1f8 * 8) = local_200;
        std::__cxx11::string::~string(local_240);
        std::__cxx11::string::~string(local_220);
      }
      sVar2 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                         &stack0xffffffffffffff40);
      *local_18 = (int)sVar2;
      local_4 = local_1f0;
      local_1bc = 1;
    }
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
               in_stack_fffffffffffffd50);
  }
  return local_4;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));

  
  int retcode = TINYEXR_SUCCESS;

  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));
    memset(exr_header, 0, sizeof(EXRHeader));

    std::string warn;
    std::string _err;
    if (!ConvertHeader(exr_header, infos[i], &warn, &_err)) {

      // Free malloc-allocated memory here.
      for (size_t k = 0; k < infos[i].attributes.size(); i++) {
        if (infos[i].attributes[k].value) {
          free(infos[i].attributes[k].value);
        }
      }

      if (!_err.empty()) {
        tinyexr::SetErrorMessage(
            _err, err);
      }
      // continue to converting headers
      retcode = TINYEXR_ERROR_INVALID_HEADER;
    }

    exr_header->multipart = exr_version->multipart ? 1 : 0;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return retcode;
}